

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QMessagePattern::BacktraceParams>::relocate
          (QArrayDataPointer<QMessagePattern::BacktraceParams> *this,qsizetype offset,
          BacktraceParams **data)

{
  bool bVar1;
  BacktraceParams *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  BacktraceParams *res;
  
  first = (BacktraceParams *)(*(long *)(in_RDI + 8) + in_RSI * 0x20);
  QtPrivate::q_relocate_overlap_n<QMessagePattern::BacktraceParams,long_long>
            (first,in_RDI,(BacktraceParams *)0x251b77);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QMessagePattern::BacktraceParams>,QMessagePattern::BacktraceParams_const*>
                        (data,(QArrayDataPointer<QMessagePattern::BacktraceParams> *)res), bVar1)) {
    *in_RDX = in_RSI * 0x20 + *in_RDX;
  }
  *(BacktraceParams **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }